

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::BuildBlockSplit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *block_ids,BlockSplit *split)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  uint8_t cur_id;
  value_type_conflict local_3c;
  BlockSplit *local_38;
  
  pbVar2 = (block_ids->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  cur_id = *pbVar2;
  uVar6 = (ulong)cur_id;
  local_3c = 1;
  uVar3 = uVar6;
  local_38 = split;
  for (uVar5 = 1;
      uVar5 < (ulong)((long)(block_ids->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2);
      uVar5 = uVar5 + 1) {
    bVar1 = pbVar2[uVar5];
    uVar4 = uVar3;
    if (bVar1 != (byte)uVar6) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&split->types,&cur_id);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&split->lengths,&local_3c)
      ;
      uVar4 = (ulong)bVar1;
      if (bVar1 < (byte)uVar3) {
        uVar4 = uVar3;
      }
      pbVar2 = (block_ids->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_3c = 0;
      cur_id = bVar1;
    }
    local_3c = local_3c + 1;
    uVar6 = (ulong)bVar1;
    uVar3 = uVar4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&split->types,&cur_id);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&split->lengths,&local_3c);
  local_38->num_types = uVar3 + 1;
  return;
}

Assistant:

void BuildBlockSplit(const std::vector<uint8_t>& block_ids, BlockSplit* split) {
  uint8_t cur_id = block_ids[0];
  uint8_t max_type = cur_id;
  uint32_t cur_length = 1;
  for (size_t i = 1; i < block_ids.size(); ++i) {
    uint8_t next_id = block_ids[i];
    if (next_id != cur_id) {
      split->types.push_back(cur_id);
      split->lengths.push_back(cur_length);
      max_type = std::max(max_type, next_id);
      cur_id = next_id;
      cur_length = 0;
    }
    ++cur_length;
  }
  split->types.push_back(cur_id);
  split->lengths.push_back(cur_length);
  split->num_types = static_cast<size_t>(max_type) + 1;
}